

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

qint64 __thiscall QFSFileEngine::readLine(QFSFileEngine *this,char *data,qint64 maxlen)

{
  QFSFileEnginePrivate *this_00;
  qint64 qVar1;
  long *in_RDI;
  QFSFileEnginePrivate *d;
  
  this_00 = d_func((QFSFileEngine *)0x19e405);
  if (this_00->lastIOCommand != IOReadCommand) {
    (**(code **)(*in_RDI + 0x20))();
    this_00->lastIOCommand = IOReadCommand;
  }
  qVar1 = QFSFileEnginePrivate::nativeReadLine(this_00,(char *)in_RDI,0x19e445);
  return qVar1;
}

Assistant:

qint64 QFSFileEngine::readLine(char *data, qint64 maxlen)
{
    Q_D(QFSFileEngine);

    // On Windows' stdlib implementation, the results of calling fread and
    // fwrite are undefined if not called either in sequence, or if preceded
    // with a call to fflush().
    if (d->lastIOCommand != QFSFileEnginePrivate::IOReadCommand) {
        flush();
        d->lastIOCommand = QFSFileEnginePrivate::IOReadCommand;
    }

    return d->nativeReadLine(data, maxlen);
}